

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O3

ValueType __thiscall ValueType::FromObject(ValueType *this,RecyclableObject *recyclableObject)

{
  TypeId typeId;
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  ulong uVar6;
  undefined8 uStack_28;
  ValueType valueType_1;
  ValueType valueType;
  
  uStack_28 = in_RAX;
  if (this == (ValueType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    recyclableObject = (RecyclableObject *)0x543;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x543,"(recyclableObject)","recyclableObject");
    if (!bVar2) goto LAB_00b1387f;
    *puVar5 = 0;
  }
  typeId = **(TypeId **)(this + 4);
  uVar6 = (ulong)typeId;
  if ((uVar6 < 0x58) && (TypeIdToBits[uVar6] != 0)) {
    ValueType((ValueType *)((long)&uStack_28 + 4),TypeIdToBits[uVar6]);
    aVar4.bits = uStack_28._4_2_;
    Verify((ValueType)uStack_28._4_2_);
    uStack_28 = CONCAT26(aVar4.bits,(undefined6)uStack_28);
    bVar2 = IsLikelyOptimizedTypedArray((ValueType *)((long)&uStack_28 + 6));
    if ((bVar2) && (*(long *)this == TypeIdToVtable[uVar6])) {
      OVar3 = GetObjectType((ValueType *)((long)&uStack_28 + 6));
      aVar4.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           GetObject(VirtualTypedArrayPair[OVar3]);
    }
  }
  else {
    bVar2 = Js::DynamicType::Is(typeId);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      recyclableObject = (RecyclableObject *)0x553;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x553,"(DynamicType::Is(typeId))","DynamicType::Is(typeId)");
      if (!bVar2) {
LAB_00b1387f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    bVar2 = Js::JavascriptArray::IsNonES5Array(typeId);
    if (bVar2) {
      aVar4.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           FromArray(Array,(JavascriptArray *)this,typeId);
      return (anon_union_2_4_ea848c7b_for_ValueType_13)
             (anon_union_2_4_ea848c7b_for_ValueType_13)aVar4.field_0;
    }
    if (*(long *)this == VirtualTableInfo<Js::DynamicObject>::Address) {
      bVar2 = Js::DynamicObject::HasObjectArray((DynamicObject *)this);
      if (bVar2) {
        aVar4.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             FromObjectWithArray(this,(DynamicObject *)recyclableObject);
        return (anon_union_2_4_ea848c7b_for_ValueType_13)
               (anon_union_2_4_ea848c7b_for_ValueType_13)aVar4.field_0;
      }
    }
    uStack_28._0_4_ = CONCAT22(0x10,(undefined2)uStack_28);
    SetObjectType((ValueType *)((long)&uStack_28 + 2),Object);
    aVar4.bits = uStack_28._2_2_;
    Verify((ValueType)uStack_28._2_2_);
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar4.field_0;
}

Assistant:

ValueType ValueType::FromObject(Js::RecyclableObject *const recyclableObject)
{
    using namespace Js;
    Assert(recyclableObject);
    const TypeId typeId = recyclableObject->GetTypeId();
    if (typeId < _countof(TypeIdToBits))
    {
        const Bits bits = TypeIdToBits[typeId];
        if (!!bits)
        {
            const ValueType valueType = Verify(bits);
            if (!valueType.IsLikelyOptimizedTypedArray())
                return valueType;
            bool isVirtual = (VirtualTableInfoBase::GetVirtualTable(recyclableObject) == ValueType::GetVirtualTypedArrayVtable(typeId));
            if (!isVirtual)
                return valueType;
            return GetObject(VirtualTypedArrayPair[static_cast<uint16>(valueType.GetObjectType())]);
        }
    }
    Assert(DynamicType::Is(typeId)); // all static type IDs have nonzero values in TypeIdToBits

    if(!JavascriptArray::IsNonES5Array(typeId))
    {
        // TODO: Once the issue with loop bodies and uninitialized interpreter local slots is fixed, use FromVar
        DynamicObject *const object = static_cast<DynamicObject *>(recyclableObject);
        if(!VirtualTableInfo<DynamicObject>::HasVirtualTable(object) || !object->HasObjectArray())
            return GetObject(ObjectType::Object);
        return FromObjectWithArray(object);
    }

    return FromArray(ObjectType::Array, static_cast<JavascriptArray *>(recyclableObject), typeId);
}